

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

int qc_list_inserttail(QcList *list,void *data)

{
  uint *puVar1;
  QcListEntry *pQVar2;
  QcListEntry *pQVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  void *pvVar5;
  QcList *pQVar6;
  QcList *pQVar7;
  
  if (list == (QcList *)0x0) {
    qc_list_inserttail_cold_3();
    pvVar5 = data;
    pQVar6 = list;
LAB_00105327:
    qc_list_inserttail_cold_2();
  }
  else {
    pvVar5 = data;
    pQVar6 = list;
    if (data == (void *)0x0) goto LAB_00105327;
    pQVar6 = (QcList *)0x18;
    pQVar3 = (QcListEntry *)malloc(0x18);
    if (pQVar3 != (QcListEntry *)0x0) {
      pQVar3->next = (QcListEntry *)0x0;
      pQVar3->prev = (QcListEntry *)0x0;
      pQVar3->data = data;
      pQVar3->next = (QcListEntry *)0x0;
      pQVar6 = (QcList *)list->tail;
      pQVar3->prev = (QcListEntry *)pQVar6;
      if (pQVar6 == (QcList *)0x0) {
        pQVar6 = list;
      }
      pQVar6->head = pQVar3;
      list->tail = pQVar3;
      list->count = list->count + 1;
      return 0;
    }
  }
  qc_list_inserttail_cold_1();
  if (pQVar6 == (QcList *)0x0) {
    qc_list_inserttail2_cold_3();
    pQVar7 = pQVar6;
  }
  else {
    pQVar7 = pQVar6;
    if (pvVar5 != (void *)0x0) {
      pQVar7 = (QcList *)0x18;
      pQVar3 = (QcListEntry *)malloc(0x18);
      if (pQVar3 != (QcListEntry *)0x0) {
        pQVar3->next = (QcListEntry *)0x0;
        pQVar3->prev = (QcListEntry *)0x0;
        pQVar3->data = pvVar5;
        pQVar3->next = (QcListEntry *)0x0;
        pQVar7 = (QcList *)pQVar6->tail;
        pQVar3->prev = (QcListEntry *)pQVar7;
        if (pQVar7 == (QcList *)0x0) {
          pQVar7 = pQVar6;
        }
        pQVar7->head = pQVar3;
        pQVar6->tail = pQVar3;
        pQVar6->count = pQVar6->count + 1;
        *extraout_RDX = pQVar3;
        return 0;
      }
      goto LAB_00105398;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_00105398:
  qc_list_inserttail2_cold_1();
  if (pQVar7 != (QcList *)0x0) {
    pQVar3 = pQVar7->head;
    if (pQVar3 == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      if (pQVar7->cur == pQVar3) {
        pQVar7->cur = pQVar3->next;
      }
      pQVar2 = pQVar3->next;
      pQVar7->head = pQVar2;
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->prev = (QcListEntry *)0x0;
      }
      puVar1 = &pQVar7->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        pQVar7->tail = (QcListEntry *)0x0;
      }
      iVar4 = (int)pQVar3->data;
      free(pQVar3);
    }
    return iVar4;
  }
  qc_list_pophead_cold_1();
  if (pQVar7 != (QcList *)0x0) {
    if (pQVar7->head == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      pQVar3 = pQVar7->tail;
      if (pQVar7->cur == pQVar3) {
        pQVar7->cur = (QcListEntry *)0x0;
      }
      pQVar6 = pQVar7;
      if (pQVar3 != pQVar7->head) {
        pQVar6 = (QcList *)pQVar3->prev;
      }
      pQVar6->head = (QcListEntry *)0x0;
      pQVar7->tail = pQVar3->prev;
      pQVar7->count = pQVar7->count - 1;
      iVar4 = (int)pQVar3->data;
      free(pQVar3);
    }
    return iVar4;
  }
  qc_list_poptail_cold_1();
  pQVar7->cur = pQVar7->head;
  return (int)pQVar7->head;
}

Assistant:

int	qc_list_inserttail(QcList *list, void *data)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    
    return 0;
}